

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::Vector<capnp::_::RawBrandedSchema::Dependency>::setCapacity
          (Vector<capnp::_::RawBrandedSchema::Dependency> *this,size_t newSize)

{
  Dependency *pDVar1;
  RemoveConst<capnp::_::RawBrandedSchema::Dependency> *pRVar2;
  Dependency *pDVar3;
  size_t __n;
  ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> newBuilder;
  ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> local_38;
  
  pDVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pDVar1 >> 4)) {
    (this->builder).pos = pDVar1 + newSize;
  }
  pDVar3 = (Dependency *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = pDVar3 + newSize;
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pDVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pDVar1;
  local_38.ptr = pDVar3;
  if (__n != 0) {
    local_38.pos = pDVar3;
    memcpy(pDVar3,pDVar1,__n);
  }
  local_38.pos = (RemoveConst<capnp::_::RawBrandedSchema::Dependency> *)((long)pDVar3 + __n);
  ArrayBuilder<capnp::_::RawBrandedSchema::Dependency>::operator=(&this->builder,&local_38);
  pDVar3 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pDVar1 = local_38.ptr;
  if (local_38.ptr != (Dependency *)0x0) {
    local_38.ptr = (Dependency *)0x0;
    local_38.pos = (RemoveConst<capnp::_::RawBrandedSchema::Dependency> *)0x0;
    local_38.endPtr = (Dependency *)0x0;
    (*(code *)**(undefined8 **)local_38.disposer)
              (local_38.disposer,pDVar1,0x10,(long)pRVar2 - (long)pDVar1 >> 4,
               (long)pDVar3 - (long)pDVar1 >> 4,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }